

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O3

bool __thiscall
basisu::etc_block::set_block_color5_clamp
          (etc_block *this,color_rgba *c0_unscaled,color_rgba *c1_unscaled)

{
  byte bVar1;
  uint16_t uVar2;
  int b;
  int g;
  int r;
  
  (this->field_0).m_bytes[3] = (this->field_0).m_bytes[3] | 2;
  uVar2 = pack_color5(c0_unscaled,false,0x7f);
  bVar1 = (this->field_0).m_bytes[1];
  (this->field_0).m_bytes[0] = (byte)(uVar2 >> 7) & 0xf8 | (this->field_0).m_bytes[0] & 7;
  (this->field_0).m_bytes[1] = (byte)(uVar2 >> 2) & 0xf8 | bVar1 & 7;
  (this->field_0).m_bytes[2] = (char)uVar2 << 3 | (this->field_0).m_bytes[2] & 7;
  r = (uint)(c1_unscaled->field_0).m_comps[0] - (uint)(c0_unscaled->field_0).m_comps[0];
  g = (uint)(c1_unscaled->field_0).m_comps[1] - (uint)(c0_unscaled->field_0).m_comps[1];
  b = (uint)(c1_unscaled->field_0).m_comps[2] - (uint)(c0_unscaled->field_0).m_comps[2];
  if (2 < r) {
    r = 3;
  }
  if (r < -3) {
    r = -4;
  }
  if (2 < g) {
    g = 3;
  }
  if (g < -3) {
    g = -4;
  }
  if (2 < b) {
    b = 3;
  }
  if (b < -3) {
    b = -4;
  }
  uVar2 = pack_delta3(r,g,b);
  bVar1 = (this->field_0).m_bytes[1];
  (this->field_0).m_bytes[0] = (byte)(uVar2 >> 6) & 7 | (this->field_0).m_bytes[0] & 0xf8;
  (this->field_0).m_bytes[1] = (byte)(uVar2 >> 3) & 7 | bVar1 & 0xf8;
  (this->field_0).m_bytes[2] = (byte)uVar2 & 7 | (this->field_0).m_bytes[2] & 0xf8;
  return true;
}

Assistant:

bool set_block_color5_clamp(const color_rgba &c0_unscaled, const color_rgba &c1_unscaled)
		{
			set_diff_bit(true);
			set_base5_color(pack_color5(c0_unscaled, false));

			int dr = c1_unscaled.r - c0_unscaled.r;
			int dg = c1_unscaled.g - c0_unscaled.g;
			int db = c1_unscaled.b - c0_unscaled.b;
			
			dr = clamp<int>(dr, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			dg = clamp<int>(dg, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			db = clamp<int>(db, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
						
			set_delta3_color(pack_delta3(dr, dg, db));

			return true;
		}